

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
update_superroot_key_domain
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this)

{
  int iVar1;
  long *in_RDI;
  byte local_9;
  
  local_9 = 1;
  if (in_RDI[0x10] != 0) {
    local_9 = *(byte *)(*in_RDI + 8);
  }
  if ((local_9 & 1) == 0) {
    __assert_fail("stats_.num_inserts == 0 || root_node_->is_leaf_",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                  ,0x2c1,
                  "void alex::Alex<int, int>::update_superroot_key_domain() [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                 );
  }
  iVar1 = get_min_key((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                       *)0x13de94);
  *(int *)((long)in_RDI + 0xa4) = iVar1;
  iVar1 = get_max_key((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                       *)0x13dea3);
  *(int *)(in_RDI + 0x15) = iVar1;
  *(int *)((long)in_RDI + 0xb4) = (int)in_RDI[5];
  *(int *)(in_RDI + 0x17) = (int)in_RDI[5];
  *(undefined4 *)((long)in_RDI + 0xac) = 0;
  *(undefined4 *)(in_RDI + 0x16) = 0;
  *(double *)(in_RDI[1] + 0x10) = 1.0 / (double)((int)in_RDI[0x15] - *(int *)((long)in_RDI + 0xa4));
  *(double *)(in_RDI[1] + 0x18) =
       (double)*(int *)((long)in_RDI + 0xa4) * -1.0 * *(double *)(in_RDI[1] + 0x10);
  return;
}

Assistant:

void update_superroot_key_domain() {
    assert(stats_.num_inserts == 0 || root_node_->is_leaf_);
    istats_.key_domain_min_ = get_min_key();
    istats_.key_domain_max_ = get_max_key();
    istats_.num_keys_at_last_right_domain_resize = stats_.num_keys;
    istats_.num_keys_at_last_left_domain_resize = stats_.num_keys;
    istats_.num_keys_above_key_domain = 0;
    istats_.num_keys_below_key_domain = 0;
    superroot_->model_.a_ =
        1.0 / (istats_.key_domain_max_ - istats_.key_domain_min_);
    superroot_->model_.b_ =
        -1.0 * istats_.key_domain_min_ * superroot_->model_.a_;
  }